

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulePropertiesDialog.cpp
# Opt level: O3

void __thiscall
ModulePropertiesDialog::ModulePropertiesDialog
          (ModulePropertiesDialog *this,Module *mod,SongListModel *model,QWidget *parent)

{
  anon_class_1_0_00000001 *paVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  QListView *this_00;
  QPushButton *pQVar5;
  QLineEdit *pQVar6;
  QSpinBox *pQVar7;
  QDialogButtonBox *pQVar8;
  QButtonGroup *pQVar9;
  QHBoxLayout *pQVar10;
  QVBoxLayout *pQVar11;
  QFrame *pQVar12;
  QGroupBox *this_01;
  QHBoxLayout *this_02;
  QLabel *pQVar13;
  Module *pMVar14;
  undefined4 *puVar15;
  void **ppvVar16;
  InfoStr *str;
  InfoStr *str_00;
  InfoStr *str_01;
  undefined1 uVar17;
  QString local_138;
  QString local_120;
  QRadioButton *local_108;
  QVBoxLayout *local_100;
  QRadioButton *local_f8;
  QRadioButton *local_f0;
  QGroupBox *local_e8;
  QGroupBox *local_e0;
  Module *local_d8;
  QObject local_d0 [8];
  QObject local_c8 [8];
  QObject local_c0 [8];
  QObject local_b8 [8];
  QObject local_b0 [8];
  QObject local_a8 [8];
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QString local_60;
  QString local_48;
  
  QDialog::QDialog(&this->super_QDialog,parent,0x8003000);
  *(undefined ***)this = &PTR_metaObject_001fbd68;
  *(undefined ***)&this->field_0x10 = &PTR__ModulePropertiesDialog_001fbf40;
  this->mModule = mod;
  this->mModel = model;
  this->mDirty = 0;
  this->mWarnRemove = true;
  local_d8 = mod;
  this_00 = (QListView *)operator_new(0x28);
  QListView::QListView(this_00,(QWidget *)0x0);
  this->mSongList = this_00;
  pQVar5 = (QPushButton *)operator_new(0x28);
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b591c);
  QPushButton::QPushButton(pQVar5,&local_138,(QWidget *)0x0);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  this->mAddButton = pQVar5;
  pQVar5 = (QPushButton *)operator_new(0x28);
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b5920);
  QPushButton::QPushButton(pQVar5,&local_138,(QWidget *)0x0);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  this->mRemoveButton = pQVar5;
  pQVar5 = (QPushButton *)operator_new(0x28);
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b5927);
  QPushButton::QPushButton(pQVar5,&local_138,(QWidget *)0x0);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  this->mDuplicateButton = pQVar5;
  pQVar5 = (QPushButton *)operator_new(0x28);
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b5931);
  QPushButton::QPushButton(pQVar5,&local_138,(QWidget *)0x0);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  this->mMoveUpButton = pQVar5;
  pQVar5 = (QPushButton *)operator_new(0x28);
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b5939);
  QPushButton::QPushButton(pQVar5,&local_138,(QWidget *)0x0);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  this->mMoveDownButton = pQVar5;
  pQVar6 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar6,(QWidget *)0x0);
  this->mTitleEdit = pQVar6;
  pQVar6 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar6,(QWidget *)0x0);
  this->mArtistEdit = pQVar6;
  pQVar6 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar6,(QWidget *)0x0);
  this->mCopyrightEdit = pQVar6;
  pQVar7 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar7,(QWidget *)0x0);
  this->mCustomSpin = pQVar7;
  pQVar8 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(pQVar8,0x400400,0);
  this->mDialogButtons = pQVar8;
  pQVar9 = (QButtonGroup *)operator_new(0x10);
  QButtonGroup::QButtonGroup(pQVar9,(QObject *)this);
  this->mFramerateRadios = pQVar9;
  QDialog::setModal(SUB81(this,0));
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b5943);
  QWidget::setWindowTitle((QString *)this);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  local_100 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(local_100);
  local_e0 = (QGroupBox *)operator_new(0x28);
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b5955);
  QGroupBox::QGroupBox(local_e0,&local_138,(QWidget *)0x0);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar10 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar10);
  (**(code **)(*(long *)this->mSongList + 0x1c8))(this->mSongList,model);
  pQVar11 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar11);
  QBoxLayout::addWidget(pQVar11,this->mAddButton,0,0);
  QBoxLayout::addWidget(pQVar11,this->mRemoveButton,0,0);
  QBoxLayout::addWidget(pQVar11,this->mDuplicateButton,0,0);
  pQVar12 = (QFrame *)operator_new(0x28);
  QFrame::QFrame(pQVar12,0,0);
  QFrame::setFrameShape((Shadow)pQVar12);
  QFrame::setFrameShadow((Shadow)pQVar12);
  QBoxLayout::addWidget(pQVar11,pQVar12,0,0);
  QBoxLayout::addWidget(pQVar11,this->mMoveUpButton,0,0);
  QBoxLayout::addWidget(pQVar11,this->mMoveDownButton,0,0);
  QBoxLayout::addStretch((int)pQVar11);
  QBoxLayout::addWidget(pQVar10,this->mSongList,1,0);
  QBoxLayout::addLayout((QLayout *)pQVar10,(int)pQVar11);
  QWidget::setLayout((QLayout *)local_e0);
  pQVar10 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar10);
  local_e8 = (QGroupBox *)operator_new(0x28);
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b595f);
  QGroupBox::QGroupBox(local_e8,&local_138,(QWidget *)0x0);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar11 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar11);
  QBoxLayout::addWidget(pQVar11,this->mTitleEdit,0,0);
  QBoxLayout::addWidget(pQVar11,this->mArtistEdit,0,0);
  QBoxLayout::addWidget(pQVar11,this->mCopyrightEdit,0,0);
  QWidget::setLayout((QLayout *)local_e8);
  this_01 = (QGroupBox *)operator_new(0x28);
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b596b);
  QGroupBox::QGroupBox(this_01,&local_138,(QWidget *)0x0);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar11 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar11);
  local_f0 = (QRadioButton *)operator_new(0x28);
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b5975);
  QRadioButton::QRadioButton(local_f0,&local_138,(QWidget *)0x0);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  local_f8 = (QRadioButton *)operator_new(0x28);
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b5983);
  QRadioButton::QRadioButton(local_f8,&local_138,(QWidget *)0x0);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  this_02 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_02);
  local_108 = (QRadioButton *)operator_new(0x28);
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b3598);
  QRadioButton::QRadioButton(local_108,&local_138,(QWidget *)0x0);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  QSpinBox::setRange((int)this->mCustomSpin,0xf);
  pQVar7 = this->mCustomSpin;
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b402e);
  QSpinBox::setSuffix((QString *)pQVar7);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  QBoxLayout::addWidget(this_02,local_108,0,0);
  QBoxLayout::addWidget(this_02,this->mCustomSpin,0,0);
  QBoxLayout::addStretch((int)this_02);
  QBoxLayout::addWidget(pQVar11,local_f0,0,0);
  QBoxLayout::addWidget(pQVar11,local_f8,0,0);
  QBoxLayout::addLayout((QLayout *)pQVar11,(int)this_02);
  QWidget::setLayout((QLayout *)this_01);
  QBoxLayout::addWidget(pQVar10,local_e8,1,0);
  QBoxLayout::addWidget(pQVar10,this_01,0,0);
  QBoxLayout::addWidget(local_100,local_e0,1,0);
  QBoxLayout::addLayout((QLayout *)local_100,(int)pQVar10);
  pQVar13 = (QLabel *)operator_new(0x28);
  QMetaObject::tr((char *)&local_120,(char *)&staticMetaObject,0x1b5991);
  pMVar14 = Module::data(local_d8);
  iVar3 = trackerboy::Module::revisionMajor(pMVar14);
  QString::number((int)&local_48,iVar3);
  pMVar14 = Module::data(local_d8);
  iVar3 = trackerboy::Module::revisionMinor(pMVar14);
  QString::number((int)&local_60,iVar3);
  QString::arg<QString,QString>(&local_138,&local_120,&local_48,&local_60);
  QLabel::QLabel(pQVar13,&local_138,0,0);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,8);
    }
  }
  bVar2 = (bool)QDialogButtonBox::button((StandardButton)this->mDialogButtons);
  QWidget::setEnabled(bVar2);
  pQVar8 = this->mDialogButtons;
  local_138.d.d = (Data *)QDialogButtonBox::accepted;
  local_138.d.ptr = (char16_t *)0x0;
  local_120.d.d = (Data *)0x1b9;
  local_120.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::QSlotObject<void_(ModulePropertiesDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar15 + 4) = 0x1b9;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)pQVar8,(QObject *)&local_138,(void **)this,
             (QSlotObjectBase *)&local_120,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  pQVar8 = this->mDialogButtons;
  local_138.d.d = (Data *)QDialogButtonBox::rejected;
  local_138.d.ptr = (char16_t *)0x0;
  local_120.d.d = (Data *)&DAT_000001c1;
  local_120.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::QSlotObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar15 + 4) = 0x1c1;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)pQVar8,(QObject *)&local_138,(void **)this,
             (QSlotObjectBase *)&local_120,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QBoxLayout::addWidget(local_100,pQVar13,0,0);
  QBoxLayout::addWidget(local_100,this->mDialogButtons,0,0);
  QLayout::setSizeConstraint((SizeConstraint)local_100);
  QWidget::setLayout((QLayout *)this);
  pQVar6 = this->mTitleEdit;
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b59a8);
  QLineEdit::setPlaceholderText((QString *)pQVar6);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar6 = this->mArtistEdit;
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b59ae);
  QLineEdit::setPlaceholderText((QString *)pQVar6);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar6 = this->mCopyrightEdit;
  QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x1b59b5);
  QLineEdit::setPlaceholderText((QString *)pQVar6);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  ppvVar16 = (void **)QAbstractItemView::selectionModel();
  local_138.d.d = (Data *)QItemSelectionModel::selectionChanged;
  local_138.d.ptr = (char16_t *)0x0;
  local_120.d.d = (Data *)updateSongButtons;
  local_120.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::QSlotObject<void_(ModulePropertiesDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar15 + 4) = updateSongButtons;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_78,ppvVar16,(QObject *)&local_138,(void **)this,(QSlotObjectBase *)&local_120,
             (ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  pMVar14 = Module::data(this->mModule);
  paVar1 = (anon_class_1_0_00000001 *)this->mTitleEdit;
  pQVar6 = (QLineEdit *)trackerboy::Module::title(pMVar14);
  ModulePropertiesDialog::anon_class_1_0_00000001::operator()(paVar1,pQVar6,str);
  paVar1 = (anon_class_1_0_00000001 *)this->mArtistEdit;
  pQVar6 = (QLineEdit *)trackerboy::Module::artist(pMVar14);
  ModulePropertiesDialog::anon_class_1_0_00000001::operator()(paVar1,pQVar6,str_00);
  paVar1 = (anon_class_1_0_00000001 *)this->mCopyrightEdit;
  pQVar6 = (QLineEdit *)trackerboy::Module::copyright(pMVar14);
  ModulePropertiesDialog::anon_class_1_0_00000001::operator()(paVar1,pQVar6,str_01);
  uVar4 = trackerboy::Module::system(pMVar14,(char *)pQVar6);
  uVar17 = SUB81(local_f0,0);
  if ((char)uVar4 != '\0') {
    uVar17 = SUB81(local_f8,0);
    if ((uVar4 & 0xff) != 1) {
      if ((uVar4 & 0xff) != 2) goto LAB_00163b2f;
      uVar17 = SUB81(local_108,0);
    }
  }
  QAbstractButton::setChecked((bool)uVar17);
LAB_00163b2f:
  pQVar7 = this->mCustomSpin;
  trackerboy::Module::customFramerate(pMVar14);
  QSpinBox::setValue((int)pQVar7);
  pQVar7 = this->mCustomSpin;
  QAbstractButton::isChecked();
  QWidget::setEnabled(SUB81(pQVar7,0));
  QButtonGroup::addButton((QAbstractButton *)this->mFramerateRadios,(int)local_f0);
  QButtonGroup::addButton((QAbstractButton *)this->mFramerateRadios,(int)local_f8);
  QButtonGroup::addButton((QAbstractButton *)this->mFramerateRadios,(int)local_108);
  updateSongButtons(this);
  pQVar5 = this->mAddButton;
  local_138.d.d = (Data *)QAbstractButton::clicked;
  local_138.d.ptr = (char16_t *)0x0;
  local_120.d.d = (Data *)add;
  local_120.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::QSlotObject<void_(ModulePropertiesDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar15 + 4) = add;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_80,(void **)pQVar5,(QObject *)&local_138,(void **)this,
             (QSlotObjectBase *)&local_120,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  pQVar5 = this->mRemoveButton;
  local_138.d.d = (Data *)QAbstractButton::clicked;
  local_138.d.ptr = (char16_t *)0x0;
  local_120.d.d = (Data *)remove;
  local_120.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::QSlotObject<void_(ModulePropertiesDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar15 + 4) = remove;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_88,(void **)pQVar5,(QObject *)&local_138,(void **)this,
             (QSlotObjectBase *)&local_120,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  pQVar5 = this->mDuplicateButton;
  local_138.d.d = (Data *)QAbstractButton::clicked;
  local_138.d.ptr = (char16_t *)0x0;
  local_120.d.d = (Data *)duplicate;
  local_120.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::QSlotObject<void_(ModulePropertiesDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar15 + 4) = duplicate;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_90,(void **)pQVar5,(QObject *)&local_138,(void **)this,
             (QSlotObjectBase *)&local_120,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  pQVar5 = this->mMoveUpButton;
  local_138.d.d = (Data *)QAbstractButton::clicked;
  local_138.d.ptr = (char16_t *)0x0;
  local_120.d.d = (Data *)moveUp;
  local_120.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::QSlotObject<void_(ModulePropertiesDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar15 + 4) = moveUp;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_98,(void **)pQVar5,(QObject *)&local_138,(void **)this,
             (QSlotObjectBase *)&local_120,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  pQVar5 = this->mMoveDownButton;
  local_138.d.d = (Data *)QAbstractButton::clicked;
  local_138.d.ptr = (char16_t *)0x0;
  local_120.d.d = (Data *)moveDown;
  local_120.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::QSlotObject<void_(ModulePropertiesDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar15 + 4) = moveDown;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_a0,(void **)pQVar5,(QObject *)&local_138,(void **)this,
             (QSlotObjectBase *)&local_120,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  pQVar7 = this->mCustomSpin;
  local_138.d.d = (Data *)QAbstractButton::toggled;
  local_138.d.ptr = (char16_t *)0x0;
  local_120.d.d = (Data *)QWidget::setEnabled;
  local_120.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x20);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::QSlotObject<void_(QWidget::*)(bool),_QtPrivate::List<bool>,_void>::impl;
  *(code **)(puVar15 + 4) = QWidget::setEnabled;
  *(undefined8 *)(puVar15 + 6) = 0;
  QObject::connectImpl
            (local_a8,(void **)local_108,(QObject *)&local_138,(void **)pQVar7,
             (QSlotObjectBase *)&local_120,(ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  pQVar6 = this->mTitleEdit;
  local_138.d.d = (Data *)QLineEdit::textChanged;
  local_138.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x18);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/ModulePropertiesDialog.cpp:309:25),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(ModulePropertiesDialog **)(puVar15 + 4) = this;
  QObject::connectImpl
            (local_b0,(void **)pQVar6,(QObject *)&local_138,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  pQVar6 = this->mArtistEdit;
  local_138.d.d = (Data *)QLineEdit::textChanged;
  local_138.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x18);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/ModulePropertiesDialog.cpp:309:25),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(ModulePropertiesDialog **)(puVar15 + 4) = this;
  QObject::connectImpl
            (local_b8,(void **)pQVar6,(QObject *)&local_138,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  pQVar6 = this->mCopyrightEdit;
  local_138.d.d = (Data *)QLineEdit::textChanged;
  local_138.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x18);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/ModulePropertiesDialog.cpp:309:25),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(ModulePropertiesDialog **)(puVar15 + 4) = this;
  QObject::connectImpl
            (local_c0,(void **)pQVar6,(QObject *)&local_138,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  pQVar9 = this->mFramerateRadios;
  local_138.d.d = (Data *)QButtonGroup::buttonToggled;
  local_138.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x18);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/ModulePropertiesDialog.cpp:314:27),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(ModulePropertiesDialog **)(puVar15 + 4) = this;
  QObject::connectImpl
            (local_c8,(void **)pQVar9,(QObject *)&local_138,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_c8);
  pQVar7 = this->mCustomSpin;
  local_138.d.d = (Data *)QSpinBox::valueChanged;
  local_138.d.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x18);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/ModulePropertiesDialog.cpp:314:27),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(ModulePropertiesDialog **)(puVar15 + 4) = this;
  QObject::connectImpl
            (local_d0,(void **)pQVar7,(QObject *)&local_138,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar15,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  return;
}

Assistant:

ModulePropertiesDialog::ModulePropertiesDialog(Module &mod, SongListModel &model, QWidget *parent) :
    QDialog(parent, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint),
    mModule(mod),
    mModel(model),
    mDirty(Clean),
    mWarnRemove(true),
    mSongList(new QListView),
    mAddButton(new QPushButton(tr("Add"))),
    mRemoveButton(new QPushButton(tr("Remove"))),
    mDuplicateButton(new QPushButton(tr("Duplicate"))),
    mMoveUpButton(new QPushButton(tr("Move up"))),
    mMoveDownButton(new QPushButton(tr("Move down"))),
    mTitleEdit(new QLineEdit),
    mArtistEdit(new QLineEdit),
    mCopyrightEdit(new QLineEdit),
    mCustomSpin(new QSpinBox),
    mDialogButtons(new QDialogButtonBox(QDialogButtonBox::Ok | QDialogButtonBox::Cancel)),
    mFramerateRadios(new QButtonGroup(this))
{
    setModal(true);
    setWindowTitle(tr("Module properties"));


    auto layout = new QVBoxLayout;

    // song list group
    auto songListGroup = new QGroupBox(tr("Song list"));
    auto songListLayout = new QHBoxLayout;
    mSongList->setModel(&model);

    auto songButtonLayout = new QVBoxLayout;
    songButtonLayout->addWidget(mAddButton);
    songButtonLayout->addWidget(mRemoveButton);
    songButtonLayout->addWidget(mDuplicateButton);
    auto line = new QFrame;
    line->setFrameShape(QFrame::HLine);
    line->setFrameShadow(QFrame::Sunken);
    songButtonLayout->addWidget(line);
    songButtonLayout->addWidget(mMoveUpButton);
    songButtonLayout->addWidget(mMoveDownButton);
    songButtonLayout->addStretch();

    songListLayout->addWidget(mSongList, 1);
    songListLayout->addLayout(songButtonLayout);
    songListGroup->setLayout(songListLayout);

    auto propLayout = new QHBoxLayout;

    auto infoGroup = new QGroupBox(tr("Information"));
    auto infoLayout = new QVBoxLayout;
    infoLayout->addWidget(mTitleEdit);
    infoLayout->addWidget(mArtistEdit);
    infoLayout->addWidget(mCopyrightEdit);
    infoGroup->setLayout(infoLayout);

    auto framerateGroup = new QGroupBox(tr("Framerate"));
    auto framerateLayout = new QVBoxLayout;
    auto dmgRadio = new QRadioButton(tr("DMG (59.7 Hz)"));
    auto sgbRadio = new QRadioButton(tr("SGB (61.1 Hz)"));
    auto customLayout = new QHBoxLayout;
    auto customRadio = new QRadioButton(tr("Custom"));
    mCustomSpin->setRange(15, 4096); // theres an issue with < 15 Hz framerates
    mCustomSpin->setSuffix(tr(" Hz"));
    customLayout->addWidget(customRadio);
    customLayout->addWidget(mCustomSpin);
    customLayout->addStretch();
    framerateLayout->addWidget(dmgRadio);
    framerateLayout->addWidget(sgbRadio);
    framerateLayout->addLayout(customLayout);
    framerateGroup->setLayout(framerateLayout);

    propLayout->addWidget(infoGroup, 1);
    propLayout->addWidget(framerateGroup);


    layout->addWidget(songListGroup, 1);
    layout->addLayout(propLayout);
    auto moduleVersionLabel = new QLabel(tr("Module revision: %1.%2").arg(
                                             QString::number(mod.data().revisionMajor()),
                                             QString::number(mod.data().revisionMinor())));

    mDialogButtons->button(QDialogButtonBox::Ok)->setEnabled(false);
    lazyconnect(mDialogButtons, accepted, this, accept);
    lazyconnect(mDialogButtons, rejected, this, reject);

    layout->addWidget(moduleVersionLabel);
    layout->addWidget(mDialogButtons);

    layout->setSizeConstraint(QLayout::SetFixedSize);
    setLayout(layout);


    mTitleEdit->setPlaceholderText(tr("Title"));
    mArtistEdit->setPlaceholderText(tr("Artist"));
    mCopyrightEdit->setPlaceholderText(tr("Copyright"));

    auto selectionModel = mSongList->selectionModel();
    lazyconnect(selectionModel, selectionChanged, this, updateSongButtons);

    auto const& moddata = mModule.data();
    auto setInfoEdit = [](QLineEdit *edit, trackerboy::InfoStr const& str) {
        edit->setMaxLength((int)str.size());
        edit->setText(QString::fromUtf8(str.data(), (int)str.length()));
    };
    setInfoEdit(mTitleEdit, moddata.title());
    setInfoEdit(mArtistEdit, moddata.artist());
    setInfoEdit(mCopyrightEdit, moddata.copyright());

    switch (moddata.system()) {
        case trackerboy::System::dmg:
            dmgRadio->setChecked(true);
            break;
        case trackerboy::System::sgb:
            sgbRadio->setChecked(true);
            break;
        case trackerboy::System::custom:
            customRadio->setChecked(true);
            break;
    }
    mCustomSpin->setValue(moddata.customFramerate());
    mCustomSpin->setEnabled(customRadio->isChecked());



    mFramerateRadios->addButton(dmgRadio, (int)trackerboy::System::dmg);
    mFramerateRadios->addButton(sgbRadio, (int)trackerboy::System::sgb);
    mFramerateRadios->addButton(customRadio, (int)trackerboy::System::custom);


    updateSongButtons();

    lazyconnect(mAddButton, clicked, this, add);
    lazyconnect(mRemoveButton, clicked, this, remove);
    lazyconnect(mDuplicateButton, clicked, this, duplicate);
    lazyconnect(mMoveUpButton, clicked, this, moveUp);
    lazyconnect(mMoveDownButton, clicked, this, moveDown);
    lazyconnect(customRadio, toggled, mCustomSpin, setEnabled);

    auto setInfoDirty = [this]() { setDirty(DirtyInfo); };
    connect(mTitleEdit, &QLineEdit::textChanged, this, setInfoDirty);
    connect(mArtistEdit, &QLineEdit::textChanged, this, setInfoDirty);
    connect(mCopyrightEdit, &QLineEdit::textChanged, this, setInfoDirty);

    auto setSystemDirty = [this]() { setDirty(DirtySystem); };
    connect(mFramerateRadios, qOverload<QAbstractButton*, bool>(&QButtonGroup::buttonToggled), this, setSystemDirty);
    connect(mCustomSpin, qOverload<int>(&QSpinBox::valueChanged), this, setSystemDirty);

}